

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

vector<vector<int>_> * __thiscall
vector<vector<int>_>::operator=(vector<vector<int>_> *this,vector<vector<int>_> *other)

{
  int iVar1;
  long *plVar2;
  undefined4 *puVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  iVar1 = other->_size;
  this->_size = iVar1;
  lVar5 = (long)other->_capacity;
  this->_capacity = other->_capacity;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar5) {
    uVar4 = lVar5 * 0x10 + 8;
  }
  plVar2 = (long *)operator_new__(uVar4);
  *plVar2 = lVar5;
  if (lVar5 != 0) {
    lVar6 = 0;
    do {
      puVar3 = (undefined4 *)operator_new__(4);
      *puVar3 = 0;
      *(undefined4 **)((long)plVar2 + lVar6 + 8) = puVar3;
      *(undefined8 *)((long)plVar2 + lVar6 + 0x10) = 0x100000000;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 * 0x10 != lVar6);
  }
  this->vect = (vector<int> *)(plVar2 + 1);
  if (0 < iVar1) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      vector<int>::operator=
                ((vector<int> *)((long)&this->vect->vect + lVar6),
                 (vector<int> *)((long)&other->vect->vect + lVar6));
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 < this->_size);
  }
  return this;
}

Assistant:

vector &operator = (const vector &other) {
        _size = other._size;
        _capacity = other._capacity;
        vect = new T[_capacity]();

        for (int i = 0; i < _size; ++i) {
            vect[i] = other[i];
        }

        return *this;
    }